

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__start_callbacks(stbi__context *s,stbi_io_callbacks *c,void *user)

{
  stbi_uc *psVar1;
  _func_void_void_ptr_int *p_Var2;
  int iVar3;
  
  (s->io).eof = c->eof;
  p_Var2 = c->skip;
  (s->io).read = c->read;
  (s->io).skip = p_Var2;
  s->io_user_data = user;
  s->read_from_callbacks = 1;
  s->buflen = 0x80;
  psVar1 = s->buffer_start;
  s->img_buffer_original = psVar1;
  iVar3 = (*(s->io).read)(user,(char *)psVar1,0x80);
  if (iVar3 == 0) {
    s->read_from_callbacks = 0;
    s->img_buffer = psVar1;
    s->img_buffer_end = s->buffer_start + 1;
    s->buffer_start[0] = '\0';
  }
  else {
    s->img_buffer = psVar1;
    s->img_buffer_end = psVar1 + iVar3;
  }
  s->img_buffer_original_end = s->img_buffer_end;
  return;
}

Assistant:

static void stbi__start_callbacks(stbi__context *s, stbi_io_callbacks *c, void *user)
{
   s->io = *c;
   s->io_user_data = user;
   s->buflen = sizeof(s->buffer_start);
   s->read_from_callbacks = 1;
   s->img_buffer_original = s->buffer_start;
   stbi__refill_buffer(s);
   s->img_buffer_original_end = s->img_buffer_end;
}